

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void do_cmd_choose_map(command *cmd)

{
  uint in_EAX;
  int iVar1;
  int *points_left_local;
  int *points_inc_local;
  int *inc;
  int *points_spent_local;
  int *st;
  undefined1 in_R8B;
  wchar_t choice;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  world = maps;
  cmd_get_arg_choice((command_conflict *)cmd,"choice",(int *)((long)&uStack_18 + 4));
  iVar1 = uStack_18._4_4_;
  while (iVar1 = iVar1 + -1, iVar1 != -1) {
    world = world->next;
    uStack_18 = CONCAT44(iVar1,(undefined4)uStack_18);
  }
  points_spent_local = (int *)0x0;
  points_left_local = (int *)0x0;
  player_generate(player,(player_race *)0x0,(player_class *)0x0,false);
  st = (int *)0x0;
  reset_stats((int *)0x0,points_spent_local,points_inc_local,points_left_local,(_Bool)in_R8B);
  generate_stats(st,points_spent_local,inc,points_left_local);
  rolled_stats = 0;
  return;
}

Assistant:

void do_cmd_choose_map(struct command *cmd)
{
	int choice = 0;
	world = maps;
	cmd_get_arg_choice(cmd, "choice", &choice);
	while (choice) {
		world = world->next;
		choice--;
	}
	player_generate(player, NULL, NULL, false);

	reset_stats(stats, points_spent, points_inc, &points_left, false);
	generate_stats(stats, points_spent, points_inc, &points_left);
	rolled_stats = false;
}